

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Expression::Deserialize(Expression *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  ExpressionClass EVar2;
  ExpressionType type;
  optional_idx oVar3;
  pointer pEVar4;
  SerializationException *this_00;
  _func_int **pp_Var5;
  undefined1 local_78 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  
  EVar2 = Deserializer::ReadProperty<duckdb::ExpressionClass>(deserializer,100,"expression_class");
  type = Deserializer::ReadProperty<duckdb::ExpressionType>(deserializer,0x65,"type");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&alias,deserializer,0x66,"alias");
  oVar3 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::optional_idx>
                    (deserializer,0x67,"query_location",(optional_idx)0xffffffffffffffff);
  SerializationData::Set<duckdb::ExpressionType>(&deserializer->data,type);
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  switch(EVar2) {
  case BOUND_AGGREGATE:
    BoundAggregateExpression::Deserialize((BoundAggregateExpression *)local_78,deserializer);
    goto LAB_01503b28;
  case BOUND_CASE:
    BoundCaseExpression::Deserialize((BoundCaseExpression *)local_78,deserializer);
    break;
  case BOUND_CAST:
    BoundCastExpression::Deserialize((BoundCastExpression *)local_78,deserializer);
    break;
  case BOUND_COLUMN_REF:
    BoundColumnRefExpression::Deserialize((BoundColumnRefExpression *)local_78,deserializer);
    break;
  case BOUND_COMPARISON:
    BoundComparisonExpression::Deserialize((BoundComparisonExpression *)local_78,deserializer);
    break;
  case BOUND_CONJUNCTION:
    BoundConjunctionExpression::Deserialize((BoundConjunctionExpression *)local_78,deserializer);
    break;
  case BOUND_CONSTANT:
    BoundConstantExpression::Deserialize((BoundConstantExpression *)local_78,deserializer);
    break;
  case BOUND_DEFAULT:
    BoundDefaultExpression::Deserialize((BoundDefaultExpression *)local_78,deserializer);
    break;
  case BOUND_FUNCTION:
    BoundFunctionExpression::Deserialize((BoundFunctionExpression *)local_78,deserializer);
    goto LAB_01503b28;
  case BOUND_OPERATOR:
    BoundOperatorExpression::Deserialize((BoundOperatorExpression *)local_78,deserializer);
    break;
  case BOUND_PARAMETER:
    BoundParameterExpression::Deserialize((BoundParameterExpression *)local_78,deserializer);
    break;
  case BOUND_REF:
    BoundReferenceExpression::Deserialize((BoundReferenceExpression *)local_78,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_78,"Unsupported type for deserialization of Expression!",
               (allocator *)(local_78 + 0x27));
    SerializationException::SerializationException(this_00,(string *)local_78);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case BOUND_WINDOW:
    BoundWindowExpression::Deserialize((BoundWindowExpression *)local_78,deserializer);
LAB_01503b28:
    uVar1 = local_78._0_8_;
    local_78._0_8_ = (_func_int **)0x0;
    pp_Var5 = (this->super_BaseExpression)._vptr_BaseExpression;
    (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)uVar1;
    if (pp_Var5 == (_func_int **)0x0) goto LAB_01503bf4;
    (**(code **)(*pp_Var5 + 8))();
    pp_Var5 = (_func_int **)local_78._0_8_;
    goto LAB_01503be9;
  case BOUND_BETWEEN:
    BoundBetweenExpression::Deserialize((BoundBetweenExpression *)local_78,deserializer);
    break;
  case BOUND_UNNEST:
    BoundUnnestExpression::Deserialize((BoundUnnestExpression *)local_78,deserializer);
    break;
  case BOUND_LAMBDA:
    BoundLambdaExpression::Deserialize((BoundLambdaExpression *)local_78,deserializer);
    break;
  case BOUND_LAMBDA_REF:
    BoundLambdaRefExpression::Deserialize((BoundLambdaRefExpression *)local_78,deserializer);
  }
  pp_Var5 = (this->super_BaseExpression)._vptr_BaseExpression;
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)local_78._0_8_;
LAB_01503be9:
  if (pp_Var5 != (_func_int **)0x0) {
    (**(code **)(*pp_Var5 + 8))();
  }
LAB_01503bf4:
  SerializationData::Unset<duckdb::ExpressionType>(&deserializer->data);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this);
  ::std::__cxx11::string::operator=
            ((string *)&(pEVar4->super_BaseExpression).alias,(string *)&alias);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this);
  (pEVar4->super_BaseExpression).query_location.index = oVar3.index;
  ::std::__cxx11::string::~string((string *)&alias);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Expression::Deserialize(Deserializer &deserializer) {
	auto expression_class = deserializer.ReadProperty<ExpressionClass>(100, "expression_class");
	auto type = deserializer.ReadProperty<ExpressionType>(101, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(102, "alias");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	deserializer.Set<ExpressionType>(type);
	unique_ptr<Expression> result;
	switch (expression_class) {
	case ExpressionClass::BOUND_AGGREGATE:
		result = BoundAggregateExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_BETWEEN:
		result = BoundBetweenExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CASE:
		result = BoundCaseExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CAST:
		result = BoundCastExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_COLUMN_REF:
		result = BoundColumnRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_COMPARISON:
		result = BoundComparisonExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CONJUNCTION:
		result = BoundConjunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CONSTANT:
		result = BoundConstantExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_DEFAULT:
		result = BoundDefaultExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_FUNCTION:
		result = BoundFunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_LAMBDA:
		result = BoundLambdaExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_LAMBDA_REF:
		result = BoundLambdaRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_OPERATOR:
		result = BoundOperatorExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_PARAMETER:
		result = BoundParameterExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_REF:
		result = BoundReferenceExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_UNNEST:
		result = BoundUnnestExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_WINDOW:
		result = BoundWindowExpression::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of Expression!");
	}
	deserializer.Unset<ExpressionType>();
	result->alias = std::move(alias);
	result->query_location = query_location;
	return result;
}